

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdVerifyEcdsaAdaptor
              (void *handle,char *adaptor_signature,char *proof,char *adaptor,char *msg,char *pubkey
              )

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_R8;
  char *in_R9;
  CfdException *except;
  exception *std_except;
  bool is_verify;
  int result;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined8 in_stack_fffffffffffffc58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffc60;
  allocator *paVar4;
  allocator local_2c9;
  string local_2c8;
  Pubkey local_2a8;
  allocator local_289;
  string local_288;
  ByteData256 local_268;
  allocator local_249;
  string local_248;
  Pubkey local_228;
  allocator local_209;
  string local_208;
  AdaptorProof local_1e8;
  allocator local_1c9;
  string local_1c8;
  AdaptorSignature local_1a8;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  CfdSourceLocation local_168;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  undefined4 local_3c;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x16c;
    local_68.funcname = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_68,"adaptor_signature is null or empty.");
    local_8a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"Failed to parameter. adaptor_signature is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc60,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_8a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x172;
    local_a8.funcname = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_a8,"proof is null or empty.");
    local_ca = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. proof is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc60,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_ca = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x178;
    local_e8.funcname = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_e8,"adaptor is null or empty.");
    local_10a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,"Failed to parameter. adaptor is null or empty.",&local_109);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc60,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_10a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_38);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,local_18,&local_1c9);
      cfd::core::AdaptorSignature::AdaptorSignature(&local_1a8,&local_1c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,local_20,&local_209);
      cfd::core::AdaptorProof::AdaptorProof(&local_1e8,&local_208);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,local_28,&local_249);
      cfd::core::Pubkey::Pubkey(&local_228,&local_248);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,local_30,&local_289);
      cfd::core::ByteData256::ByteData256(&local_268,&local_288);
      paVar4 = &local_2c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c8,local_38,paVar4);
      cfd::core::Pubkey::Pubkey(&local_2a8,&local_2c8);
      bVar2 = cfd::core::AdaptorUtil::Verify(&local_1a8,&local_1e8,&local_228,&local_268,&local_2a8)
      ;
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5cd9c4);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5cd9eb);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5cda12);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      cfd::core::AdaptorProof::~AdaptorProof((AdaptorProof *)0x5cda39);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      cfd::core::AdaptorSignature::~AdaptorSignature((AdaptorSignature *)0x5cda60);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      if ((bVar2 & 1) == 0) {
        local_4 = 7;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    local_168.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_168.filename = local_168.filename + 1;
    local_168.line = 0x184;
    local_168.funcname = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_168,"pubkey is null or empty.");
    local_18a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_188,"Failed to parameter. pubkey is null or empty.",&local_189);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc60,error_code,
               (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    local_18a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_128.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_128.filename = local_128.filename + 1;
  local_128.line = 0x17e;
  local_128.funcname = "CfdVerifyEcdsaAdaptor";
  cfd::core::logger::warn<>(&local_128,"msg is null or empty.");
  local_14a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"Failed to parameter. msg is null or empty.",&local_149);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffc60,error_code,
             (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  local_14a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* proof,
    const char* adaptor, const char* msg, const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(proof)) {
      warn(CFD_LOG_SOURCE, "proof is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. proof is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    bool is_verify = AdaptorUtil::Verify(
        AdaptorSignature(adaptor_signature), AdaptorProof(proof),
        Pubkey(adaptor), ByteData256(msg), Pubkey(pubkey));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}